

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_wrapper_n(uchar *script,size_t script_len,size_t *write_len)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  
  sVar2 = *write_len;
  iVar3 = -2;
  if ((sVar2 != 0) && (uVar1 = sVar2 + 1, uVar1 < 0x2711 && uVar1 <= script_len)) {
    script[sVar2] = 0x92;
    *write_len = uVar1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int generate_by_wrapper_n(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len || (used_len + 1 > script_len) || (used_len + 1 > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE))
        return WALLY_EINVAL;

    script[used_len] = OP_0NOTEQUAL;
    *write_len = used_len + 1;
    return WALLY_OK;
}